

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool updateAndroidManifest(Options *options)

{
  QKeyValueIterator<const_QString_&,_QString_&,_QMap<QString,_QString>::iterator> rhs;
  QKeyValueIterator<const_QString_&,_QString_&,_QMap<QString,_QString>::iterator> rhs_00;
  QLatin1StringView str_00;
  QAnyStringView s;
  QLatin1StringView str_01;
  QStringView sv;
  QLatin1StringView str_02;
  QStringView sv_00;
  QLatin1StringView str_03;
  QAnyStringView s_00;
  QLatin1StringView str_04;
  QAnyStringView s_01;
  QLatin1StringView s_02;
  QLatin1StringView str_05;
  QLatin1StringView str_06;
  QLatin1StringView str_07;
  QLatin1StringView str_08;
  QLatin1StringView str_09;
  QLatin1StringView str_10;
  QAnyStringView qualifiedName;
  QAnyStringView qualifiedName_00;
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  bool bVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  QHash<QString,_QString> *replacements_00;
  QString *pQVar5;
  QString *pQVar6;
  ulong uVar7;
  QMap<QString,_QString> *this;
  char *pcVar8;
  long in_RDI;
  long in_FS_OFFSET;
  undefined1 auVar9 [16];
  bool checkOldAndroidLabelString;
  QString *feature;
  add_const_t<QList<QString>_> *__range1_2;
  QString *extras_1;
  QString *name_1;
  QKeyValueRange<QMap<QString,_QString>_&> *__range1_1;
  QString *extras;
  QString *name;
  QKeyValueRange<QMap<QString,_QString>_&> *__range1;
  char16_t *str_1;
  char16_t *str_5;
  char16_t *str;
  char16_t *str_6;
  char16_t *str_4;
  char16_t *str_3;
  char16_t *str_2;
  char16_t *str_7;
  QStringView value;
  QStringView name_2;
  QXmlStreamReader reader_1;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  QString features;
  key_value_iterator __end1_1;
  key_value_iterator __begin1_1;
  QString permissions;
  key_value_iterator __end1;
  key_value_iterator __begin1;
  QMap<QString,_QString> resolvedPermissions;
  QXmlStreamReader reader;
  QFile androidManifestXml;
  QString androidManifestPath;
  QString iconAttribute;
  QHash<QString,_QString> replacements;
  ArgBase *argBases [2];
  ArgBase *argBases_1 [2];
  ArgBase *argBases_2 [2];
  undefined4 in_stack_fffffffffffff4c8;
  CaseSensitivity in_stack_fffffffffffff4cc;
  undefined7 in_stack_fffffffffffff4d0;
  undefined1 in_stack_fffffffffffff4d7;
  iterator in_stack_fffffffffffff4d8;
  FILE *pFVar10;
  undefined4 in_stack_fffffffffffff4e0;
  undefined4 uVar11;
  int in_stack_fffffffffffff4e4;
  undefined4 uVar12;
  undefined5 in_stack_fffffffffffff4e8;
  undefined1 in_stack_fffffffffffff4ed;
  bool bVar13;
  byte in_stack_fffffffffffff4ee;
  undefined1 in_stack_fffffffffffff4ef;
  int in_stack_fffffffffffff4f0;
  uint in_stack_fffffffffffff4f4;
  size_t in_stack_fffffffffffff4f8;
  qsizetype in_stack_fffffffffffff500;
  char *in_stack_fffffffffffff508;
  undefined1 uVar14;
  QChar in_stack_fffffffffffff51e;
  undefined8 in_stack_fffffffffffff528;
  QChar QVar15;
  byte local_969;
  QString local_830 [3];
  QChar local_7e2;
  QLatin1StringView local_7e0;
  undefined1 local_7c0 [24];
  undefined1 local_7a8 [16];
  undefined1 local_788 [24];
  undefined1 local_770 [16];
  QLatin1StringView local_760;
  undefined1 local_750 [16];
  QLatin1StringView local_740;
  undefined1 local_720 [24];
  undefined1 local_708 [16];
  QLatin1StringView local_6d0;
  undefined1 local_6c0 [16];
  QLatin1StringView local_6b0;
  undefined1 local_6a0 [16];
  undefined1 local_680 [24];
  undefined1 local_668 [16];
  QLatin1StringView local_630;
  undefined1 local_620 [16];
  undefined8 local_610 [5];
  QArrayDataPointer<char16_t> local_5e8 [3];
  QLatin1StringView local_5a0;
  undefined1 local_590 [24];
  QString *local_578;
  const_iterator local_570;
  const_iterator local_568;
  undefined8 local_560;
  undefined8 local_558;
  undefined8 local_550;
  QArrayDataPointer<char16_t> local_548 [3];
  QChar local_4fa;
  QLatin1StringView local_4f8;
  undefined1 local_4e8 [48];
  pair<const_QString_&,_QString_&> local_4b8;
  iterator local_4a8;
  _Base_ptr local_4a0;
  iterator local_498;
  iterator local_490;
  QKeyValueRangeStorage<QMap<QString,_QString>_&> local_488;
  undefined8 local_480;
  undefined8 local_478;
  undefined8 local_470;
  pair<const_QString_&,_QString_&> local_468;
  iterator local_458;
  _Base_ptr local_450;
  iterator local_448;
  iterator local_440;
  QKeyValueRangeStorage<QMap<QString,_QString>_&> local_438;
  undefined8 local_430;
  undefined1 local_418 [24];
  char local_400 [40];
  undefined1 local_3d8 [24];
  char local_3c0 [24];
  QLatin1StringView local_3a8;
  undefined1 local_398 [16];
  undefined8 local_388 [2];
  undefined8 local_378;
  undefined8 local_370;
  QLatin1StringView local_368;
  QString local_340;
  QChar local_322;
  QLatin1StringView local_320;
  QChar local_2f2 [13];
  undefined8 local_2d8;
  undefined8 local_2d0;
  undefined8 local_2c8;
  QArrayDataPointer<char16_t> local_2c0 [2];
  QLatin1StringView local_290;
  undefined1 local_280 [24];
  QArrayDataPointer<char16_t> local_268 [2];
  QArrayDataPointer<char16_t> local_238 [2];
  QArrayDataPointer<char16_t> local_208 [2];
  QArrayDataPointer<char16_t> local_1d8 [2];
  QArrayDataPointer<char16_t> local_1a8 [2];
  QHash<QString,_QString> local_178 [3];
  undefined1 local_160 [24];
  qsizetype local_148;
  char *local_140;
  ulong local_138;
  ArgBase **local_130;
  undefined1 local_118 [24];
  qsizetype local_100;
  char *local_f8;
  ulong local_f0;
  ArgBase **local_e8;
  undefined1 local_d0 [24];
  qsizetype local_b8;
  char *local_b0;
  ulong local_a8;
  ArgBase **local_a0;
  ulong local_98;
  ArgBase **local_90;
  ulong local_88;
  ArgBase **local_80;
  ulong local_78;
  ArgBase **local_70;
  ulong local_68;
  ArgBase **local_60;
  ulong local_58;
  ArgBase **local_50;
  ulong local_48;
  ArgBase **local_40;
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 *local_28;
  undefined8 local_20;
  undefined1 *local_18;
  undefined8 local_10;
  long local_8;
  
  QVar15.ucs = (char16_t)((ulong)in_stack_fffffffffffff528 >> 0x30);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(byte *)(in_RDI + 1) & 1) != 0) {
    fprintf(_stdout,"  -- AndroidManifest.xml \n");
  }
  local_178[0].d = (Data *)0xaaaaaaaaaaaaaaaa;
  QHash<QString,_QString>::QHash(local_178);
  replacements_00 = (QHash<QString,_QString> *)(in_RDI + 0x3c0);
  QArrayDataPointer<char16_t>::QArrayDataPointer
            (local_1a8,(Data *)0x0,L"-- %%INSERT_APP_NAME%% --",0x19);
  QString::QString((QString *)CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0),
                   (DataPointer *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
  pQVar5 = QHash<QString,_QString>::operator[]
                     ((QHash<QString,_QString> *)
                      CONCAT44(in_stack_fffffffffffff4e4,in_stack_fffffffffffff4e0),
                      (QString *)in_stack_fffffffffffff4d8._M_node);
  QString::operator=(pQVar5,(QString *)replacements_00);
  QString::~QString((QString *)0x11b96a);
  QArrayDataPointer<char16_t>::~QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)
             CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0));
  pQVar5 = (QString *)(in_RDI + 0x1e8);
  QArrayDataPointer<char16_t>::QArrayDataPointer
            (local_1d8,(Data *)0x0,L"-- %%INSERT_APP_ARGUMENTS%% --",0x1e);
  QString::QString((QString *)CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0),
                   (DataPointer *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
  pQVar6 = QHash<QString,_QString>::operator[]
                     ((QHash<QString,_QString> *)
                      CONCAT44(in_stack_fffffffffffff4e4,in_stack_fffffffffffff4e0),
                      (QString *)in_stack_fffffffffffff4d8._M_node);
  QString::operator=(pQVar6,(QString *)pQVar5);
  QString::~QString((QString *)0x11ba1b);
  QArrayDataPointer<char16_t>::~QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)
             CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0));
  QArrayDataPointer<char16_t>::QArrayDataPointer
            (local_208,(Data *)0x0,L"-- %%INSERT_APP_LIB_NAME%% --",0x1d);
  QString::QString((QString *)CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0),
                   (DataPointer *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
  pQVar6 = QHash<QString,_QString>::operator[]
                     ((QHash<QString,_QString> *)
                      CONCAT44(in_stack_fffffffffffff4e4,in_stack_fffffffffffff4e0),
                      (QString *)in_stack_fffffffffffff4d8._M_node);
  QString::operator=(pQVar6,(QString *)(in_RDI + 0x1d0));
  QString::~QString((QString *)0x11bacc);
  QArrayDataPointer<char16_t>::~QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)
             CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0));
  QArrayDataPointer<char16_t>::QArrayDataPointer
            (local_238,(Data *)0x0,L"-- %%INSERT_VERSION_NAME%% --",0x1d);
  QString::QString((QString *)CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0),
                   (DataPointer *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
  pQVar6 = QHash<QString,_QString>::operator[]
                     ((QHash<QString,_QString> *)
                      CONCAT44(in_stack_fffffffffffff4e4,in_stack_fffffffffffff4e0),
                      (QString *)in_stack_fffffffffffff4d8._M_node);
  QString::operator=(pQVar6,(QString *)(in_RDI + 0x290));
  QString::~QString((QString *)0x11bb83);
  QArrayDataPointer<char16_t>::~QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)
             CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0));
  QArrayDataPointer<char16_t>::QArrayDataPointer
            (local_268,(Data *)0x0,L"-- %%INSERT_VERSION_CODE%% --",0x1d);
  QString::QString((QString *)CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0),
                   (DataPointer *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
  pQVar6 = QHash<QString,_QString>::operator[]
                     ((QHash<QString,_QString> *)
                      CONCAT44(in_stack_fffffffffffff4e4,in_stack_fffffffffffff4e0),
                      (QString *)in_stack_fffffffffffff4d8._M_node);
  QString::operator=(pQVar6,(QString *)(in_RDI + 0x2a8));
  QString::~QString((QString *)0x11bc3a);
  QArrayDataPointer<char16_t>::~QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)
             CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0));
  local_290 = Qt::Literals::StringLiterals::operator____L1
                        ((char *)in_stack_fffffffffffff4d8._M_node,
                         CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0));
  local_b8 = local_290.m_size;
  local_b0 = local_290.m_data;
  str_00.m_size._4_4_ = in_stack_fffffffffffff4e4;
  str_00.m_size._0_4_ = in_stack_fffffffffffff4e0;
  str_00.m_data._0_5_ = in_stack_fffffffffffff4e8;
  str_00.m_data._5_1_ = in_stack_fffffffffffff4ed;
  str_00.m_data._6_1_ = in_stack_fffffffffffff4ee;
  str_00.m_data._7_1_ = in_stack_fffffffffffff4ef;
  QAnyStringView::QAnyStringView((QAnyStringView *)in_stack_fffffffffffff4d8._M_node,str_00);
  QAnyStringView::QAnyStringView
            ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff4e4,in_stack_fffffffffffff4e0),
             (QString *)in_stack_fffffffffffff4d8._M_node);
  s.field_0._4_4_ = in_stack_fffffffffffff4e4;
  s.field_0._0_4_ = in_stack_fffffffffffff4e0;
  s.m_size._0_5_ = in_stack_fffffffffffff4e8;
  s.m_size._5_1_ = in_stack_fffffffffffff4ed;
  s.m_size._6_1_ = in_stack_fffffffffffff4ee;
  s.m_size._7_1_ = in_stack_fffffffffffff4ef;
  QtPrivate::qStringLikeToArg(s);
  local_88 = local_a8;
  local_80 = local_a0;
  local_38 = local_d0;
  local_30 = 0;
  local_98 = local_a8;
  local_90 = local_a0;
  QtPrivate::argToQString((QAnyStringView *)local_280,local_a8,local_a0);
  QArrayDataPointer<char16_t>::QArrayDataPointer
            (local_2c0,(Data *)0x0,L"package=\"org.qtproject.example\"",0x1f);
  QString::QString((QString *)CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0),
                   (DataPointer *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
  QHash<QString,_QString>::operator[]
            ((QHash<QString,_QString> *)
             CONCAT44(in_stack_fffffffffffff4e4,in_stack_fffffffffffff4e0),
             (QString *)in_stack_fffffffffffff4d8._M_node);
  QString::operator=((QString *)CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0),
                     (QString *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
  QString::~QString((QString *)0x11be64);
  QArrayDataPointer<char16_t>::~QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)
             CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0));
  QString::~QString((QString *)0x11be7e);
  local_2d8 = 0xaaaaaaaaaaaaaaaa;
  local_2d0 = 0xaaaaaaaaaaaaaaaa;
  local_2c8 = 0xaaaaaaaaaaaaaaaa;
  Qt::Literals::StringLiterals::operator____L1
            ((char *)in_stack_fffffffffffff4d8._M_node,
             CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0));
  latin1.m_data = in_stack_fffffffffffff508;
  latin1.m_size = in_stack_fffffffffffff500;
  QString::QString((QString *)CONCAT44(in_stack_fffffffffffff4e4,in_stack_fffffffffffff4e0),latin1);
  bVar1 = QString::isEmpty((QString *)0x11befd);
  if (bVar1) {
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffff4d8._M_node,
               CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0));
    latin1_00.m_data = in_stack_fffffffffffff508;
    latin1_00.m_size = in_stack_fffffffffffff500;
    QString::QString((QString *)CONCAT44(in_stack_fffffffffffff4e4,in_stack_fffffffffffff4e0),
                     latin1_00);
  }
  else {
    QVar15.ucs = (char16_t)((ulong)(in_RDI + 0x3d8) >> 0x30);
    QChar::QChar<char16_t,_true>(local_2f2,L' ');
    QString::arg<QString,_true>
              ((QString *)CONCAT44(in_stack_fffffffffffff4f4,in_stack_fffffffffffff4f0),
               (QString *)
               CONCAT17(in_stack_fffffffffffff4ef,
                        CONCAT16(in_stack_fffffffffffff4ee,
                                 CONCAT15(in_stack_fffffffffffff4ed,in_stack_fffffffffffff4e8))),
               in_stack_fffffffffffff4e4,in_stack_fffffffffffff51e);
  }
  local_320 = Qt::Literals::StringLiterals::operator____L1
                        ((char *)in_stack_fffffffffffff4d8._M_node,
                         CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0));
  QChar::QChar<char16_t,_true>(&local_322,L' ');
  QString::arg<QLatin1String,_true>
            ((QString *)
             CONCAT17(in_stack_fffffffffffff4ef,
                      CONCAT16(in_stack_fffffffffffff4ee,
                               CONCAT15(in_stack_fffffffffffff4ed,in_stack_fffffffffffff4e8))),
             (QLatin1String *)CONCAT44(in_stack_fffffffffffff4e4,in_stack_fffffffffffff4e0),
             (int)((ulong)in_stack_fffffffffffff4d8._M_node >> 0x20),QVar15);
  QHash<QString,_QString>::operator[]
            ((QHash<QString,_QString> *)
             CONCAT44(in_stack_fffffffffffff4e4,in_stack_fffffffffffff4e0),
             (QString *)in_stack_fffffffffffff4d8._M_node);
  QString::operator=((QString *)CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0),
                     (QString *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
  QString::~QString((QString *)0x11c019);
  QString::~QString((QString *)0x11c026);
  local_340.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_340.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  local_340.d.size = -0x5555555555555556;
  local_368 = Qt::Literals::StringLiterals::operator____L1
                        ((char *)in_stack_fffffffffffff4d8._M_node,
                         CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0));
  operator+((QString *)CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0),
            (QLatin1String *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
  QStringBuilder::operator_cast_to_QString
            ((QStringBuilder<QString_&,_QLatin1String> *)
             CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
  local_378 = 0xaaaaaaaaaaaaaaaa;
  local_370 = 0xaaaaaaaaaaaaaaaa;
  QFile::QFile((QFile *)&local_378,(QString *)&local_340);
  uVar7 = QFile::exists();
  if ((uVar7 & 1) != 0) {
    QFlags<QIODeviceBase::OpenModeFlag>::QFlags
              ((QFlags<QIODeviceBase::OpenModeFlag> *)
               CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0),
               in_stack_fffffffffffff4cc);
    uVar7 = QFile::open((QFlags *)&local_378);
    if ((uVar7 & 1) != 0) {
      local_388[0] = 0xaaaaaaaaaaaaaaaa;
      QXmlStreamReader::QXmlStreamReader((QXmlStreamReader *)local_388,(QIODevice *)&local_378);
      while( true ) {
        bVar2 = QXmlStreamReader::atEnd();
        if (((bVar2 ^ 0xff) & 1) == 0) break;
        QXmlStreamReader::readNext();
        bVar1 = QXmlStreamReader::isStartElement((QXmlStreamReader *)0x11c184);
        in_stack_fffffffffffff51e.ucs = in_stack_fffffffffffff51e.ucs & 0xff;
        if (bVar1) {
          auVar9 = QXmlStreamReader::name();
          uVar14 = (undefined1)in_stack_fffffffffffff51e.ucs;
          local_398 = auVar9;
          local_3a8 = Qt::Literals::StringLiterals::operator____L1
                                ((char *)in_stack_fffffffffffff4d8._M_node,
                                 CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0));
          bVar1 = operator==((QStringView *)
                             CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0),
                             (QLatin1StringView *)
                             CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
          in_stack_fffffffffffff51e.ucs = CONCAT11(bVar1,uVar14);
        }
        if ((char)((ushort)in_stack_fffffffffffff51e.ucs >> 8) != '\0') {
          this = (QMap<QString,_QString> *)(in_RDI + 0x5a0);
          QXmlStreamReader::attributes();
          Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_stack_fffffffffffff4d8._M_node,
                     CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0));
          str_01.m_size._4_4_ = in_stack_fffffffffffff4e4;
          str_01.m_size._0_4_ = in_stack_fffffffffffff4e0;
          str_01.m_data._0_5_ = in_stack_fffffffffffff4e8;
          str_01.m_data._5_1_ = in_stack_fffffffffffff4ed;
          str_01.m_data._6_1_ = in_stack_fffffffffffff4ee;
          str_01.m_data._7_1_ = in_stack_fffffffffffff4ef;
          QAnyStringView::QAnyStringView((QAnyStringView *)in_stack_fffffffffffff4d8._M_node,str_01)
          ;
          QXmlStreamAttributes::value((QAnyStringView *)local_3d8);
          sv.m_size._4_4_ = in_stack_fffffffffffff4e4;
          sv.m_size._0_4_ = in_stack_fffffffffffff4e0;
          sv.m_data._0_5_ = in_stack_fffffffffffff4e8;
          sv.m_data._5_1_ = in_stack_fffffffffffff4ed;
          sv.m_data._6_1_ = in_stack_fffffffffffff4ee;
          sv.m_data._7_1_ = in_stack_fffffffffffff4ef;
          QString::QString((QString *)in_stack_fffffffffffff4d8._M_node,sv);
          QMap<QString,_QString>::remove(this,local_3c0);
          QString::~QString((QString *)0x11c2c6);
          QXmlStreamAttributes::~QXmlStreamAttributes((QXmlStreamAttributes *)0x11c2d3);
          QXmlStreamReader::attributes();
          Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_stack_fffffffffffff4d8._M_node,
                     CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0));
          str_02.m_size._4_4_ = in_stack_fffffffffffff4e4;
          str_02.m_size._0_4_ = in_stack_fffffffffffff4e0;
          str_02.m_data._0_5_ = in_stack_fffffffffffff4e8;
          str_02.m_data._5_1_ = in_stack_fffffffffffff4ed;
          str_02.m_data._6_1_ = in_stack_fffffffffffff4ee;
          str_02.m_data._7_1_ = in_stack_fffffffffffff4ef;
          QAnyStringView::QAnyStringView((QAnyStringView *)in_stack_fffffffffffff4d8._M_node,str_02)
          ;
          QXmlStreamAttributes::value((QAnyStringView *)local_418);
          sv_00.m_size._4_4_ = in_stack_fffffffffffff4e4;
          sv_00.m_size._0_4_ = in_stack_fffffffffffff4e0;
          sv_00.m_data._0_5_ = in_stack_fffffffffffff4e8;
          sv_00.m_data._5_1_ = in_stack_fffffffffffff4ed;
          sv_00.m_data._6_1_ = in_stack_fffffffffffff4ee;
          sv_00.m_data._7_1_ = in_stack_fffffffffffff4ef;
          QString::QString((QString *)in_stack_fffffffffffff4d8._M_node,sv_00);
          QMap<QString,_QString>::remove((QMap<QString,_QString> *)(in_RDI + 0x5a8),local_400);
          QString::~QString((QString *)0x11c3a2);
          QXmlStreamAttributes::~QXmlStreamAttributes((QXmlStreamAttributes *)0x11c3af);
        }
      }
      QFileDevice::close();
      QXmlStreamReader::~QXmlStreamReader((QXmlStreamReader *)local_388);
    }
  }
  local_430 = 0xaaaaaaaaaaaaaaaa;
  QMap<QString,_QString>::QMap
            ((QMap<QString,_QString> *)CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0)
             ,(QMap<QString,_QString> *)
              CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
  local_438.m_map =
       (QMap<QString,_QString> *)
       QMap<QString,_QString>::asKeyValueRange
                 ((QMap<QString,_QString> *)
                  CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0));
  local_440._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
  local_440._M_node =
       (_Base_ptr)
       QtPrivate::QKeyValueRange<QMap<QString,_QString>_&>::begin
                 ((QKeyValueRange<QMap<QString,_QString>_&> *)
                  CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
  local_448.i._M_node = (iterator)(_Base_ptr)0xaaaaaaaaaaaaaaaa;
  local_448.i._M_node =
       (iterator)
       QtPrivate::QKeyValueRange<QMap<QString,_QString>_&>::end
                 ((QKeyValueRange<QMap<QString,_QString>_&> *)
                  CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
  while( true ) {
    local_450 = local_440._M_node;
    local_458 = local_448.i._M_node;
    rhs.i.i._M_node._7_1_ = in_stack_fffffffffffff4d7;
    rhs.i.i._M_node._0_7_ = in_stack_fffffffffffff4d0;
    bVar1 = operator!=((QKeyValueIterator<const_QString_&,_QString_&,_QMap<QString,_QString>::iterator>
                        )in_stack_fffffffffffff4d8._M_node,rhs);
    if (!bVar1) break;
    local_468.second = (QString *)0xaaaaaaaaaaaaaaaa;
    local_468.first = (QString *)0xaaaaaaaaaaaaaaaa;
    local_468 = QKeyValueIterator<const_QString_&,_QString_&,_QMap<QString,_QString>::iterator>::
                operator*((QKeyValueIterator<const_QString_&,_QString_&,_QMap<QString,_QString>::iterator>
                           *)CONCAT17(in_stack_fffffffffffff4ef,
                                      CONCAT16(in_stack_fffffffffffff4ee,
                                               CONCAT15(in_stack_fffffffffffff4ed,
                                                        in_stack_fffffffffffff4e8))));
    std::get<0ul,QString_const&,QString&>((pair<const_QString_&,_QString_&> *)0x11c517);
    std::get<1ul,QString_const&,QString&>((pair<const_QString_&,_QString_&> *)0x11c53e);
    QMap<QString,_QString>::insert
              ((QMap<QString,_QString> *)
               CONCAT44(in_stack_fffffffffffff4e4,in_stack_fffffffffffff4e0),
               (QString *)in_stack_fffffffffffff4d8._M_node,
               (QString *)CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0));
    QKeyValueIterator<const_QString_&,_QString_&,_QMap<QString,_QString>::iterator>::operator++
              ((QKeyValueIterator<const_QString_&,_QString_&,_QMap<QString,_QString>::iterator> *)
               CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0));
  }
  local_480 = 0xaaaaaaaaaaaaaaaa;
  local_478 = 0xaaaaaaaaaaaaaaaa;
  local_470 = 0xaaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x11c5b7);
  local_488.m_map =
       (QMap<QString,_QString> *)
       QMap<QString,_QString>::asKeyValueRange
                 ((QMap<QString,_QString> *)
                  CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0));
  local_490._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
  local_490._M_node =
       (_Base_ptr)
       QtPrivate::QKeyValueRange<QMap<QString,_QString>_&>::begin
                 ((QKeyValueRange<QMap<QString,_QString>_&> *)
                  CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
  local_498.i._M_node = (iterator)(_Base_ptr)0xaaaaaaaaaaaaaaaa;
  local_498.i._M_node =
       (iterator)
       QtPrivate::QKeyValueRange<QMap<QString,_QString>_&>::end
                 ((QKeyValueRange<QMap<QString,_QString>_&> *)
                  CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
  while( true ) {
    local_4a0 = local_490._M_node;
    local_4a8 = local_498.i._M_node;
    rhs_00.i.i._M_node._7_1_ = in_stack_fffffffffffff4d7;
    rhs_00.i.i._M_node._0_7_ = in_stack_fffffffffffff4d0;
    bVar1 = operator!=((QKeyValueIterator<const_QString_&,_QString_&,_QMap<QString,_QString>::iterator>
                        )in_stack_fffffffffffff4d8._M_node,rhs_00);
    if (!bVar1) break;
    local_4b8.second = (QString *)0xaaaaaaaaaaaaaaaa;
    local_4b8.first = (QString *)0xaaaaaaaaaaaaaaaa;
    local_4b8 = QKeyValueIterator<const_QString_&,_QString_&,_QMap<QString,_QString>::iterator>::
                operator*((QKeyValueIterator<const_QString_&,_QString_&,_QMap<QString,_QString>::iterator>
                           *)CONCAT17(in_stack_fffffffffffff4ef,
                                      CONCAT16(in_stack_fffffffffffff4ee,
                                               CONCAT15(in_stack_fffffffffffff4ed,
                                                        in_stack_fffffffffffff4e8))));
    std::get<0ul,QString_const&,QString&>((pair<const_QString_&,_QString_&> *)0x11c6ce);
    std::get<1ul,QString_const&,QString&>((pair<const_QString_&,_QString_&> *)0x11c6f5);
    local_4f8 = Qt::Literals::StringLiterals::operator____L1
                          ((char *)in_stack_fffffffffffff4d8._M_node,
                           CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0));
    local_100 = local_4f8.m_size;
    local_f8 = local_4f8.m_data;
    str_03.m_size._4_4_ = in_stack_fffffffffffff4e4;
    str_03.m_size._0_4_ = in_stack_fffffffffffff4e0;
    str_03.m_data._0_5_ = in_stack_fffffffffffff4e8;
    str_03.m_data._5_1_ = in_stack_fffffffffffff4ed;
    str_03.m_data._6_1_ = in_stack_fffffffffffff4ee;
    str_03.m_data._7_1_ = in_stack_fffffffffffff4ef;
    QAnyStringView::QAnyStringView((QAnyStringView *)in_stack_fffffffffffff4d8._M_node,str_03);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff4e4,in_stack_fffffffffffff4e0),
               (QString *)in_stack_fffffffffffff4d8._M_node);
    s_00.field_0._4_4_ = in_stack_fffffffffffff4e4;
    s_00.field_0._0_4_ = in_stack_fffffffffffff4e0;
    s_00.m_size._0_5_ = in_stack_fffffffffffff4e8;
    s_00.m_size._5_1_ = in_stack_fffffffffffff4ed;
    s_00.m_size._6_1_ = in_stack_fffffffffffff4ee;
    s_00.m_size._7_1_ = in_stack_fffffffffffff4ef;
    QtPrivate::qStringLikeToArg(s_00);
    local_68 = local_f0;
    local_60 = local_e8;
    local_28 = local_118;
    local_20 = 0;
    local_78 = local_f0;
    local_70 = local_e8;
    QtPrivate::argToQString((QAnyStringView *)local_4e8,local_f0,local_e8);
    QChar::QChar<char16_t,_true>(&local_4fa,L' ');
    QString::arg<QString,_true>
              ((QString *)CONCAT44(in_stack_fffffffffffff4f4,in_stack_fffffffffffff4f0),
               (QString *)
               CONCAT17(in_stack_fffffffffffff4ef,
                        CONCAT16(in_stack_fffffffffffff4ee,
                                 CONCAT15(in_stack_fffffffffffff4ed,in_stack_fffffffffffff4e8))),
               in_stack_fffffffffffff4e4,in_stack_fffffffffffff51e);
    QString::operator+=((QString *)CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0),
                        (QString *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
    QString::~QString((QString *)0x11c8e6);
    QString::~QString((QString *)0x11c8f3);
    QKeyValueIterator<const_QString_&,_QString_&,_QMap<QString,_QString>::iterator>::operator++
              ((QKeyValueIterator<const_QString_&,_QString_&,_QMap<QString,_QString>::iterator> *)
               CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0));
  }
  QString::trimmed((QString *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
  QArrayDataPointer<char16_t>::QArrayDataPointer
            (local_548,(Data *)0x0,L"<!-- %%INSERT_PERMISSIONS -->",0x1d);
  QString::QString((QString *)CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0),
                   (DataPointer *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
  QHash<QString,_QString>::operator[]
            ((QHash<QString,_QString> *)
             CONCAT44(in_stack_fffffffffffff4e4,in_stack_fffffffffffff4e0),
             (QString *)in_stack_fffffffffffff4d8._M_node);
  QString::operator=((QString *)CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0),
                     (QString *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
  QString::~QString((QString *)0x11c9ae);
  QArrayDataPointer<char16_t>::~QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)
             CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0));
  QString::~QString((QString *)0x11c9c8);
  local_560 = 0xaaaaaaaaaaaaaaaa;
  local_558 = 0xaaaaaaaaaaaaaaaa;
  local_550 = 0xaaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x11ca02);
  local_568.i = (QString *)0xaaaaaaaaaaaaaaaa;
  local_568 = QList<QString>::begin
                        ((QList<QString> *)
                         CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0));
  local_570.i = (QString *)0xaaaaaaaaaaaaaaaa;
  local_570 = QList<QString>::end((QList<QString> *)
                                  CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0));
  while( true ) {
    local_578 = local_570.i;
    bVar1 = QList<QString>::const_iterator::operator!=(&local_568,local_570);
    if (!bVar1) break;
    QList<QString>::const_iterator::operator*(&local_568);
    local_5a0 = Qt::Literals::StringLiterals::operator____L1
                          ((char *)in_stack_fffffffffffff4d8._M_node,
                           CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0));
    local_148 = local_5a0.m_size;
    local_140 = local_5a0.m_data;
    str_04.m_size._4_4_ = in_stack_fffffffffffff4e4;
    str_04.m_size._0_4_ = in_stack_fffffffffffff4e0;
    str_04.m_data._0_5_ = in_stack_fffffffffffff4e8;
    str_04.m_data._5_1_ = in_stack_fffffffffffff4ed;
    str_04.m_data._6_1_ = in_stack_fffffffffffff4ee;
    str_04.m_data._7_1_ = in_stack_fffffffffffff4ef;
    QAnyStringView::QAnyStringView((QAnyStringView *)in_stack_fffffffffffff4d8._M_node,str_04);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff4e4,in_stack_fffffffffffff4e0),
               (QString *)in_stack_fffffffffffff4d8._M_node);
    s_01.field_0._4_4_ = in_stack_fffffffffffff4e4;
    s_01.field_0._0_4_ = in_stack_fffffffffffff4e0;
    s_01.m_size._0_5_ = in_stack_fffffffffffff4e8;
    s_01.m_size._5_1_ = in_stack_fffffffffffff4ed;
    s_01.m_size._6_1_ = in_stack_fffffffffffff4ee;
    s_01.m_size._7_1_ = in_stack_fffffffffffff4ef;
    QtPrivate::qStringLikeToArg(s_01);
    local_48 = local_138;
    local_40 = local_130;
    local_18 = local_160;
    local_10 = 0;
    local_58 = local_138;
    local_50 = local_130;
    QtPrivate::argToQString((QAnyStringView *)local_590,local_138,local_130);
    QString::operator+=((QString *)CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0),
                        (QString *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
    QString::~QString((QString *)0x11cc6c);
    QList<QString>::const_iterator::operator++(&local_568);
  }
  if ((*(byte *)(in_RDI + 0x598) & 1) != 0) {
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffff4d8._M_node,
               CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0));
    s_02.m_size._4_4_ = in_stack_fffffffffffff4e4;
    s_02.m_size._0_4_ = in_stack_fffffffffffff4e0;
    s_02.m_data._0_5_ = in_stack_fffffffffffff4e8;
    s_02.m_data._5_1_ = in_stack_fffffffffffff4ed;
    s_02.m_data._6_1_ = in_stack_fffffffffffff4ee;
    s_02.m_data._7_1_ = in_stack_fffffffffffff4ef;
    QString::operator+=((QString *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8),
                        s_02);
  }
  QString::trimmed((QString *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
  QArrayDataPointer<char16_t>::QArrayDataPointer
            (local_5e8,(Data *)0x0,L"<!-- %%INSERT_FEATURES -->",0x1a);
  QString::QString((QString *)CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0),
                   (DataPointer *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
  QHash<QString,_QString>::operator[]
            ((QHash<QString,_QString> *)
             CONCAT44(in_stack_fffffffffffff4e4,in_stack_fffffffffffff4e0),
             (QString *)in_stack_fffffffffffff4d8._M_node);
  QString::operator=((QString *)CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0),
                     (QString *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
  QString::~QString((QString *)0x11cd76);
  QArrayDataPointer<char16_t>::~QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)
             CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0));
  QString::~QString((QString *)0x11cd90);
  bVar1 = updateFile(pQVar5,replacements_00);
  if (bVar1) {
    bVar1 = false;
    uVar7 = QFile::exists();
    if ((uVar7 & 1) == 0) {
      fprintf(_stderr,"No android manifest file");
      local_969 = 0;
    }
    else {
      QFlags<QIODeviceBase::OpenModeFlag>::QFlags
                ((QFlags<QIODeviceBase::OpenModeFlag> *)
                 CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0),
                 in_stack_fffffffffffff4cc);
      uVar7 = QFile::open((QFlags *)&local_378);
      if ((uVar7 & 1) == 0) {
        pFVar10 = _stderr;
        QtPrivate::asString(&local_340);
        QString::toLocal8Bit
                  ((QString *)
                   CONCAT17(in_stack_fffffffffffff4ef,
                            CONCAT16(in_stack_fffffffffffff4ee,
                                     CONCAT15(in_stack_fffffffffffff4ed,in_stack_fffffffffffff4e8)))
                  );
        pcVar8 = QByteArray::constData((QByteArray *)0x11ce42);
        fprintf(pFVar10,"Cannot open %s for reading.\n",pcVar8);
        QByteArray::~QByteArray((QByteArray *)0x11ce65);
        local_969 = 0;
      }
      else {
        local_610[0] = 0xaaaaaaaaaaaaaaaa;
        QXmlStreamReader::QXmlStreamReader((QXmlStreamReader *)local_610,(QIODevice *)&local_378);
        do {
          do {
            while( true ) {
              do {
                bVar2 = QXmlStreamReader::atEnd();
                if (((bVar2 ^ 0xff) & 1) == 0) {
                  bVar4 = QXmlStreamReader::hasError((QXmlStreamReader *)0x11d591);
                  if (bVar4) {
                    pFVar10 = _stderr;
                    QtPrivate::asString(&local_340);
                    QString::toLocal8Bit
                              ((QString *)
                               CONCAT17(in_stack_fffffffffffff4ef,
                                        CONCAT16(in_stack_fffffffffffff4ee,
                                                 CONCAT15(in_stack_fffffffffffff4ed,
                                                          in_stack_fffffffffffff4e8))));
                    pcVar8 = QByteArray::constData((QByteArray *)0x11d5d3);
                    uVar11 = SUB84(pcVar8,0);
                    uVar12 = (undefined4)((ulong)pcVar8 >> 0x20);
                    QXmlStreamReader::errorString();
                    QtPrivate::asString(local_830);
                    QString::toLocal8Bit
                              ((QString *)
                               CONCAT17(in_stack_fffffffffffff4ef,
                                        CONCAT16(in_stack_fffffffffffff4ee,
                                                 CONCAT15(in_stack_fffffffffffff4ed,
                                                          in_stack_fffffffffffff4e8))));
                    pcVar8 = QByteArray::constData((QByteArray *)0x11d617);
                    fprintf(pFVar10,"Error in %s: %s\n",CONCAT44(uVar12,uVar11),pcVar8);
                    QByteArray::~QByteArray((QByteArray *)0x11d63f);
                    QString::~QString((QString *)0x11d64c);
                    QByteArray::~QByteArray((QByteArray *)0x11d659);
                    local_969 = 0;
                    bVar4 = true;
                  }
                  else {
                    bVar4 = false;
                  }
                  goto LAB_0011d679;
                }
                QXmlStreamReader::readNext();
                bVar4 = QXmlStreamReader::isStartElement((QXmlStreamReader *)0x11ced3);
              } while (!bVar4);
              auVar9 = QXmlStreamReader::name();
              local_620 = auVar9;
              local_630 = Qt::Literals::StringLiterals::operator____L1
                                    ((char *)in_stack_fffffffffffff4d8._M_node,
                                     CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0));
              bVar4 = operator==((QStringView *)
                                 CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0),
                                 (QLatin1StringView *)
                                 CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
              if (bVar4) break;
              auVar9 = QXmlStreamReader::name();
              local_6a0 = auVar9;
              local_6b0 = Qt::Literals::StringLiterals::operator____L1
                                    ((char *)in_stack_fffffffffffff4d8._M_node,
                                     CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0));
              bVar3 = operator==((QStringView *)
                                 CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0),
                                 (QLatin1StringView *)
                                 CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
              bVar13 = false;
              bVar4 = false;
              if (bVar3) {
LAB_0011d179:
                QXmlStreamReader::attributes();
                bVar13 = true;
                Qt::Literals::StringLiterals::operator____L1
                          ((char *)in_stack_fffffffffffff4d8._M_node,
                           CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0));
                str_07.m_size._4_4_ = in_stack_fffffffffffff4e4;
                str_07.m_size._0_4_ = in_stack_fffffffffffff4e0;
                str_07.m_data._0_5_ = in_stack_fffffffffffff4e8;
                str_07.m_data._5_1_ = in_stack_fffffffffffff4ed;
                str_07.m_data._6_1_ = in_stack_fffffffffffff4ee;
                str_07.m_data._7_1_ = in_stack_fffffffffffff4ef;
                QAnyStringView::QAnyStringView
                          ((QAnyStringView *)in_stack_fffffffffffff4d8._M_node,str_07);
                qualifiedName_00.field_0._4_4_ = in_stack_fffffffffffff4f4;
                qualifiedName_00.field_0._0_4_ = in_stack_fffffffffffff4f0;
                qualifiedName_00.m_size = in_stack_fffffffffffff4f8;
                bVar3 = QXmlStreamAttributes::hasAttribute
                                  ((QXmlStreamAttributes *)
                                   CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8),
                                   qualifiedName_00);
                in_stack_fffffffffffff4ef = false;
                if (bVar3) {
                  QXmlStreamReader::attributes();
                  bVar4 = true;
                  Qt::Literals::StringLiterals::operator____L1
                            ((char *)in_stack_fffffffffffff4d8._M_node,
                             CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0));
                  str_08.m_size._4_4_ = in_stack_fffffffffffff4e4;
                  str_08.m_size._0_4_ = in_stack_fffffffffffff4e0;
                  str_08.m_data._0_5_ = in_stack_fffffffffffff4e8;
                  str_08.m_data._5_1_ = in_stack_fffffffffffff4ed;
                  str_08.m_data._6_1_ = in_stack_fffffffffffff4ee;
                  str_08.m_data._7_1_ = in_stack_fffffffffffff4ef;
                  QAnyStringView::QAnyStringView
                            ((QAnyStringView *)in_stack_fffffffffffff4d8._M_node,str_08);
                  auVar9 = QXmlStreamAttributes::value((QAnyStringView *)local_720);
                  local_708 = auVar9;
                  local_740 = Qt::Literals::StringLiterals::operator____L1
                                        ((char *)in_stack_fffffffffffff4d8._M_node,
                                         CONCAT17(in_stack_fffffffffffff4d7,
                                                  in_stack_fffffffffffff4d0));
                  in_stack_fffffffffffff4ef =
                       operator==((QStringView *)
                                  CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0),
                                  (QLatin1StringView *)
                                  CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
                }
              }
              else {
                auVar9 = QXmlStreamReader::name();
                local_6c0 = auVar9;
                local_6d0 = Qt::Literals::StringLiterals::operator____L1
                                      ((char *)in_stack_fffffffffffff4d8._M_node,
                                       CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0)
                                      );
                bVar3 = operator==((QStringView *)
                                   CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0),
                                   (QLatin1StringView *)
                                   CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
                in_stack_fffffffffffff4ef = false;
                if (bVar3) goto LAB_0011d179;
              }
              in_stack_fffffffffffff4ee = in_stack_fffffffffffff4ef;
              in_stack_fffffffffffff4ef = in_stack_fffffffffffff4ee;
              if (bVar4) {
                QXmlStreamAttributes::~QXmlStreamAttributes((QXmlStreamAttributes *)0x11d2e6);
              }
              if (bVar13) {
                QXmlStreamAttributes::~QXmlStreamAttributes((QXmlStreamAttributes *)0x11d2ff);
              }
              if ((in_stack_fffffffffffff4ee & 1) == 0) {
                auVar9 = QXmlStreamReader::name();
                local_750 = auVar9;
                local_760 = Qt::Literals::StringLiterals::operator____L1
                                      ((char *)in_stack_fffffffffffff4d8._M_node,
                                       CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0)
                                      );
                bVar4 = operator==((QStringView *)
                                   CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0),
                                   (QLatin1StringView *)
                                   CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
                if (bVar4) {
                  local_770._0_8_ = 0xaaaaaaaaaaaaaaaa;
                  local_770._8_8_ = 0xaaaaaaaaaaaaaaaa;
                  QXmlStreamReader::attributes();
                  Qt::Literals::StringLiterals::operator____L1
                            ((char *)in_stack_fffffffffffff4d8._M_node,
                             CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0));
                  str_09.m_size._4_4_ = in_stack_fffffffffffff4e4;
                  str_09.m_size._0_4_ = in_stack_fffffffffffff4e0;
                  str_09.m_data._0_5_ = in_stack_fffffffffffff4e8;
                  str_09.m_data._5_1_ = in_stack_fffffffffffff4ed;
                  str_09.m_data._6_1_ = in_stack_fffffffffffff4ee;
                  str_09.m_data._7_1_ = in_stack_fffffffffffff4ef;
                  QAnyStringView::QAnyStringView
                            ((QAnyStringView *)in_stack_fffffffffffff4d8._M_node,str_09);
                  local_770 = QXmlStreamAttributes::value((QAnyStringView *)local_788);
                  QXmlStreamAttributes::~QXmlStreamAttributes((QXmlStreamAttributes *)0x11d41d);
                  local_7a8._0_8_ = 0xaaaaaaaaaaaaaaaa;
                  local_7a8._8_8_ = 0xaaaaaaaaaaaaaaaa;
                  QXmlStreamReader::attributes();
                  Qt::Literals::StringLiterals::operator____L1
                            ((char *)in_stack_fffffffffffff4d8._M_node,
                             CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0));
                  str_10.m_size._4_4_ = in_stack_fffffffffffff4e4;
                  str_10.m_size._0_4_ = in_stack_fffffffffffff4e0;
                  str_10.m_data._0_5_ = in_stack_fffffffffffff4e8;
                  str_10.m_data._5_1_ = in_stack_fffffffffffff4ed;
                  str_10.m_data._6_1_ = in_stack_fffffffffffff4ee;
                  str_10.m_data._7_1_ = in_stack_fffffffffffff4ef;
                  QAnyStringView::QAnyStringView
                            ((QAnyStringView *)in_stack_fffffffffffff4d8._M_node,str_10);
                  local_7a8 = QXmlStreamAttributes::value((QAnyStringView *)local_7c0);
                  QXmlStreamAttributes::~QXmlStreamAttributes((QXmlStreamAttributes *)0x11d4c8);
                  local_7e0 = Qt::Literals::StringLiterals::operator____L1
                                        ((char *)in_stack_fffffffffffff4d8._M_node,
                                         CONCAT17(in_stack_fffffffffffff4d7,
                                                  in_stack_fffffffffffff4d0));
                  bVar4 = operator==((QStringView *)
                                     CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0),
                                     (QLatin1StringView *)
                                     CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
                  bVar13 = false;
                  if (bVar4) {
                    QChar::QChar<char16_t,_true>(&local_7e2,L' ');
                    QVar15.ucs._1_1_ = in_stack_fffffffffffff4ef;
                    QVar15.ucs._0_1_ = in_stack_fffffffffffff4ee;
                    bVar13 = QStringView::contains
                                       ((QStringView *)
                                        CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0
                                                ),QVar15,in_stack_fffffffffffff4cc);
                  }
                  if (bVar13 != false) {
                    fprintf(_stderr,
                            "The Activity\'s android.app.lib_name should not contain spaces.\n");
                    local_969 = 0;
                    bVar4 = true;
                    goto LAB_0011d679;
                  }
                  in_stack_fffffffffffff4ed = 0;
                }
              }
              else {
                bVar1 = true;
              }
            }
            QXmlStreamReader::attributes();
            Qt::Literals::StringLiterals::operator____L1
                      ((char *)in_stack_fffffffffffff4d8._M_node,
                       CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0));
            str_05.m_size._4_4_ = in_stack_fffffffffffff4e4;
            str_05.m_size._0_4_ = in_stack_fffffffffffff4e0;
            str_05.m_data._0_5_ = in_stack_fffffffffffff4e8;
            str_05.m_data._5_1_ = in_stack_fffffffffffff4ed;
            str_05.m_data._6_1_ = in_stack_fffffffffffff4ee;
            str_05.m_data._7_1_ = in_stack_fffffffffffff4ef;
            QAnyStringView::QAnyStringView
                      ((QAnyStringView *)in_stack_fffffffffffff4d8._M_node,str_05);
            qualifiedName.field_0._4_4_ = in_stack_fffffffffffff4f4;
            qualifiedName.field_0._0_4_ = in_stack_fffffffffffff4f0;
            qualifiedName.m_size = in_stack_fffffffffffff4f8;
            bVar4 = QXmlStreamAttributes::hasAttribute
                              ((QXmlStreamAttributes *)
                               CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8),
                               qualifiedName);
            in_stack_fffffffffffff4f4 = CONCAT13(bVar4,(int3)in_stack_fffffffffffff4f4);
            QXmlStreamAttributes::~QXmlStreamAttributes((QXmlStreamAttributes *)0x11cfb9);
          } while ((in_stack_fffffffffffff4f4 & 0x1000000) == 0);
          QXmlStreamReader::attributes();
          Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_stack_fffffffffffff4d8._M_node,
                     CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0));
          str_06.m_size._4_4_ = in_stack_fffffffffffff4e4;
          str_06.m_size._0_4_ = in_stack_fffffffffffff4e0;
          str_06.m_data._0_5_ = in_stack_fffffffffffff4e8;
          str_06.m_data._5_1_ = in_stack_fffffffffffff4ed;
          str_06.m_data._6_1_ = in_stack_fffffffffffff4ee;
          str_06.m_data._7_1_ = in_stack_fffffffffffff4ef;
          QAnyStringView::QAnyStringView((QAnyStringView *)in_stack_fffffffffffff4d8._M_node,str_06)
          ;
          auVar9 = QXmlStreamAttributes::value((QAnyStringView *)local_680);
          local_668 = auVar9;
          in_stack_fffffffffffff4f0 =
               QStringView::toInt((QStringView *)in_stack_fffffffffffff4d8._M_node,
                                  (bool *)CONCAT17(in_stack_fffffffffffff4d7,
                                                   in_stack_fffffffffffff4d0),
                                  in_stack_fffffffffffff4cc);
          QXmlStreamAttributes::~QXmlStreamAttributes((QXmlStreamAttributes *)0x11d06d);
        } while (0x1b < in_stack_fffffffffffff4f0);
        fprintf(_stderr,"Invalid minSdkVersion version, minSdkVersion must be >= 28\n");
        local_969 = 0;
        bVar4 = true;
LAB_0011d679:
        QXmlStreamReader::~QXmlStreamReader((QXmlStreamReader *)local_610);
        if (!bVar4) {
          if (bVar1) {
            updateStringsXml((Options *)
                             CONCAT44(in_stack_fffffffffffff4f4,in_stack_fffffffffffff4f0));
          }
          local_969 = 1;
        }
      }
    }
  }
  else {
    local_969 = 0;
  }
  QString::~QString((QString *)0x11d6f9);
  QString::~QString((QString *)0x11d706);
  QMap<QString,_QString>::~QMap((QMap<QString,_QString> *)0x11d713);
  QFile::~QFile((QFile *)&local_378);
  QString::~QString((QString *)0x11d72d);
  QString::~QString((QString *)0x11d73a);
  QHash<QString,_QString>::~QHash
            ((QHash<QString,_QString> *)
             CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_969 & 1);
}

Assistant:

bool updateAndroidManifest(Options &options)
{
    if (options.verbose)
        fprintf(stdout, "  -- AndroidManifest.xml \n");

    QHash<QString, QString> replacements;
    replacements[QStringLiteral("-- %%INSERT_APP_NAME%% --")] = options.appName;
    replacements[QStringLiteral("-- %%INSERT_APP_ARGUMENTS%% --")] = options.applicationArguments;
    replacements[QStringLiteral("-- %%INSERT_APP_LIB_NAME%% --")] = options.applicationBinary;
    replacements[QStringLiteral("-- %%INSERT_VERSION_NAME%% --")] = options.versionName;
    replacements[QStringLiteral("-- %%INSERT_VERSION_CODE%% --")] = options.versionCode;
    replacements[QStringLiteral("package=\"org.qtproject.example\"")] = "package=\"%1\""_L1.arg(options.packageName);

    const QString iconAttribute = "android:icon=\"%1\""_L1;
    replacements[iconAttribute.arg("-- %%INSERT_APP_ICON%% --"_L1)] = options.appIcon.isEmpty() ?
            ""_L1 : iconAttribute.arg(options.appIcon);

    const QString androidManifestPath = options.outputDirectory + "/AndroidManifest.xml"_L1;
    QFile androidManifestXml(androidManifestPath);
    // User may have manually defined permissions in the AndroidManifest.xml
    // Read these permissions in order to remove any duplicates, as otherwise the
    // application build would fail.
    if (androidManifestXml.exists() && androidManifestXml.open(QIODevice::ReadOnly)) {
        QXmlStreamReader reader(&androidManifestXml);
        while (!reader.atEnd()) {
            reader.readNext();
            if (reader.isStartElement() && reader.name() == "uses-permission"_L1) {
                options.modulePermissions.remove(
                        QString(reader.attributes().value("android:name"_L1)));
                options.applicationPermissions.remove(
                        QString(reader.attributes().value("android:name"_L1)));
            }
        }
        androidManifestXml.close();
    }

    // Application may define permissions in its CMakeLists.txt, give them the priority
    QMap<QString, QString> resolvedPermissions = options.modulePermissions;
    for (auto [name, extras] : options.applicationPermissions.asKeyValueRange())
        resolvedPermissions.insert(name, extras);

    QString permissions;
    for (auto [name, extras] : resolvedPermissions.asKeyValueRange())
        permissions += "    <uses-permission android:name=\"%1\" %2 />\n"_L1.arg(name).arg(extras);
    replacements[QStringLiteral("<!-- %%INSERT_PERMISSIONS -->")] = permissions.trimmed();

    QString features;
    for (const QString &feature : std::as_const(options.features))
        features += "    <uses-feature android:name=\"%1\" android:required=\"false\" />\n"_L1.arg(feature);
    if (options.usesOpenGL)
        features += "    <uses-feature android:glEsVersion=\"0x00020000\" android:required=\"true\" />"_L1;

    replacements[QStringLiteral("<!-- %%INSERT_FEATURES -->")] = features.trimmed();

    if (!updateFile(androidManifestPath, replacements))
        return false;

    // read the package, min & target sdk API levels from manifest file.
    bool checkOldAndroidLabelString = false;
    if (androidManifestXml.exists()) {
        if (!androidManifestXml.open(QIODevice::ReadOnly)) {
            fprintf(stderr, "Cannot open %s for reading.\n", qPrintable(androidManifestPath));
            return false;
        }

        QXmlStreamReader reader(&androidManifestXml);
        while (!reader.atEnd()) {
            reader.readNext();

            if (reader.isStartElement()) {
                if (reader.name() == "uses-sdk"_L1) {
                    if (reader.attributes().hasAttribute("android:minSdkVersion"_L1))
                        if (reader.attributes().value("android:minSdkVersion"_L1).toInt() < 28) {
                            fprintf(stderr, "Invalid minSdkVersion version, minSdkVersion must be >= 28\n");
                            return false;
                        }
                } else if ((reader.name() == "application"_L1 ||
                            reader.name() == "activity"_L1) &&
                           reader.attributes().hasAttribute("android:label"_L1) &&
                           reader.attributes().value("android:label"_L1) == "@string/app_name"_L1) {
                    checkOldAndroidLabelString = true;
                } else if (reader.name() == "meta-data"_L1) {
                    const auto name = reader.attributes().value("android:name"_L1);
                    const auto value = reader.attributes().value("android:value"_L1);
                    if (name == "android.app.lib_name"_L1 && value.contains(u' ')) {
                        fprintf(stderr, "The Activity's android.app.lib_name should not contain"
                                        " spaces.\n");
                        return false;
                    }
                }
            }
        }

        if (reader.hasError()) {
            fprintf(stderr, "Error in %s: %s\n", qPrintable(androidManifestPath), qPrintable(reader.errorString()));
            return false;
        }
    } else {
        fprintf(stderr, "No android manifest file");
        return false;
    }

    if (checkOldAndroidLabelString)
        updateStringsXml(options);

    return true;
}